

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup3.c
# Opt level: O0

uint32_t ATLget_hash(char *str)

{
  uint32_t uVar1;
  size_t length;
  char *in_RDI;
  
  length = strlen(in_RDI);
  uVar1 = hashlittle(in_RDI,length,0);
  return uVar1;
}

Assistant:

uint32_t
ATLget_hash(const char*str)
{
    return hashlittle(str, strlen(str), 0);
}